

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O0

Configuration *
rc::detail::anon_unknown_10::configFromMap
          (Configuration *__return_storage_ptr__,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *map,Configuration *defaults)

{
  Configuration *pCVar1;
  allocator local_2b1;
  string local_2b0;
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  undefined1 local_21;
  Configuration *local_20;
  Configuration *defaults_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *map_local;
  Configuration *config;
  
  local_21 = 0;
  local_20 = defaults;
  defaults_local = (Configuration *)map;
  map_local = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)__return_storage_ptr__;
  Configuration::Configuration(__return_storage_ptr__,defaults);
  pCVar1 = defaults_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"seed",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"\'seed\' must be a valid integer",&local_81);
  (anonymous_namespace)::loadParam<unsigned_long,bool(unsigned_long_const&)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)pCVar1,&local_48,(unsigned_long *)__return_storage_ptr__,&local_80,
             anything<unsigned_long>);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pCVar1 = defaults_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"max_success",&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d0,"\'max_success\' must be a valid non-negative integer",&local_d1);
  (anonymous_namespace)::loadParam<int,bool(int)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)pCVar1,&local_a8,&(__return_storage_ptr__->testParams).maxSuccess,&local_d0,
             isNonNegative<int>);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  pCVar1 = defaults_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"max_size",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_120,"\'max_size\' must be a valid non-negative integer",&local_121);
  (anonymous_namespace)::loadParam<int,bool(int)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)pCVar1,&local_f8,&(__return_storage_ptr__->testParams).maxSize,&local_120,
             isNonNegative<int>);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  pCVar1 = defaults_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"max_discard_ratio",&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_170,"\'max_discard_ratio\' must be a valid non-negative integer",
             &local_171);
  (anonymous_namespace)::loadParam<int,bool(int)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)pCVar1,&local_148,&(__return_storage_ptr__->testParams).maxDiscardRatio,&local_170,
             isNonNegative<int>);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  pCVar1 = defaults_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"noshrink",&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c0,"\'noshrink\' must be either \'1\' or \'0\'",&local_1c1);
  (anonymous_namespace)::loadParam<bool,bool(bool_const&)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)pCVar1,&local_198,&(__return_storage_ptr__->testParams).disableShrinking,&local_1c0,
             anything<bool>);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  pCVar1 = defaults_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"verbose_progress",&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_210,"\'verbose_progress\' must be either \'1\' or \'0\'",&local_211);
  (anonymous_namespace)::loadParam<bool,bool(bool_const&)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)pCVar1,&local_1e8,&__return_storage_ptr__->verboseProgress,&local_210,anything<bool>
            );
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  pCVar1 = defaults_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,"verbose_shrinking",&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_260,"\'verbose_shrinking\' must be either \'1\' or \'0\'",&local_261);
  (anonymous_namespace)::loadParam<bool,bool(bool_const&)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)pCVar1,&local_238,&__return_storage_ptr__->verboseShrinking,&local_260,
             anything<bool>);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  pCVar1 = defaults_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_288,"reproduce",&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2b0,"\'reproduce\' string has invalid format",&local_2b1);
  (anonymous_namespace)::
  loadParam<std::unordered_map<std::__cxx11::string,rc::detail::Reproduce,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,rc::detail::Reproduce>>>,bool(std::unordered_map<std::__cxx11::string,rc::detail::Reproduce,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,rc::detail::Reproduce>>>const&)>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)pCVar1,&local_288,&__return_storage_ptr__->reproduce,&local_2b0,
             (anonymous_namespace)::
             anything<std::unordered_map<std::__cxx11::string,rc::detail::Reproduce,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,rc::detail::Reproduce>>>>
            );
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  return __return_storage_ptr__;
}

Assistant:

Configuration configFromMap(const std::map<std::string, std::string> &map,
                            const Configuration &defaults) {
  Configuration config(defaults);

  loadParam(map,
            "seed",
            config.testParams.seed,
            "'seed' must be a valid integer",
            anything<uint64_t>);

  loadParam(map,
            "max_success",
            config.testParams.maxSuccess,
            "'max_success' must be a valid non-negative integer",
            isNonNegative<int>);

  loadParam(map,
            "max_size",
            config.testParams.maxSize,
            "'max_size' must be a valid non-negative integer",
            isNonNegative<int>);

  loadParam(map,
            "max_discard_ratio",
            config.testParams.maxDiscardRatio,
            "'max_discard_ratio' must be a valid non-negative integer",
            isNonNegative<int>);

  loadParam(map,
            "noshrink",
            config.testParams.disableShrinking,
            "'noshrink' must be either '1' or '0'",
            anything<bool>);

  loadParam(map,
            "verbose_progress",
            config.verboseProgress,
            "'verbose_progress' must be either '1' or '0'",
            anything<bool>);

  loadParam(map,
            "verbose_shrinking",
            config.verboseShrinking,
            "'verbose_shrinking' must be either '1' or '0'",
            anything<bool>);

  loadParam(map,
            "reproduce",
            config.reproduce,
            "'reproduce' string has invalid format",
            anything<decltype(config.reproduce)>);

  return config;
}